

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

bool __thiscall ON_FontMetrics::HeightsAreValid(ON_FontMetrics *this)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = AscentDescentAndUPMAreValid(this);
  if (bVar2) {
    iVar1 = this->m_ascent;
    bVar2 = false;
    if ((iVar1 - this->m_descent <= this->m_line_space) &&
       (bVar2 = false, (int)(uint)this->m_ascent_of_capital <= iVar1)) {
      bVar2 = (int)(uint)this->m_ascent_of_x <= iVar1;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_FontMetrics::HeightsAreValid() const
{
  // basic validation
  if (false == AscentDescentAndUPMAreValid() )
    return false;

  // sanity check
  if (m_line_space < m_ascent - m_descent)
    return false;
  if (((int)m_ascent_of_capital) > m_ascent)
    return false;
  if (((int)m_ascent_of_x) > m_ascent)
    return false;

  return true;
}